

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

Vec_Int_t * Gia_PolynCoreCollect(Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Int_t *vOrder)

{
  int i;
  int iVar1;
  int iVar2;
  int i_00;
  int i_01;
  Vec_Int_t *vNodes;
  Vec_Bit_t *p;
  
  vNodes = Vec_IntAlloc(1000);
  p = Vec_BitStart(pGia->nObjs);
  i = vOrder->nSize;
  while (0 < i) {
    i = i + -1;
    iVar1 = Vec_IntEntry(vOrder,i);
    iVar1 = iVar1 * 6;
    iVar2 = Vec_IntEntry(vAdds,iVar1);
    i_00 = Vec_IntEntry(vAdds,iVar1 + 1);
    i_01 = Vec_IntEntry(vAdds,iVar1 + 2);
    Vec_BitWriteEntry(p,iVar2,1);
    Vec_BitWriteEntry(p,i_00,1);
    Vec_BitWriteEntry(p,i_01,1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 + 3);
    iVar1 = Vec_IntEntry(vAdds,iVar1 + 4);
    Gia_PolynCoreCollect_rec(pGia,iVar2,vNodes,p);
    Gia_PolynCoreCollect_rec(pGia,iVar1,vNodes,p);
  }
  Vec_BitFree(p);
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_PolynCoreCollect( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Int_t * vOrder )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vVisited = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, Index, Entry1, Entry2, Entry3;
    Vec_IntForEachEntryReverse( vOrder, Index, i )
    {
        // mark inputs
        Entry1 = Vec_IntEntry( vAdds, 6*Index + 0 );
        Entry2 = Vec_IntEntry( vAdds, 6*Index + 1 );
        Entry3 = Vec_IntEntry( vAdds, 6*Index + 2 );
        Vec_BitWriteEntry( vVisited, Entry1, 1 );
        Vec_BitWriteEntry( vVisited, Entry2, 1 );
        Vec_BitWriteEntry( vVisited, Entry3, 1 );
        // traverse from outputs
        Entry1 = Vec_IntEntry( vAdds, 6*Index + 3 );
        Entry2 = Vec_IntEntry( vAdds, 6*Index + 4 );
        Gia_PolynCoreCollect_rec( pGia, Entry1, vNodes, vVisited );
        Gia_PolynCoreCollect_rec( pGia, Entry2, vNodes, vVisited );
    }
    Vec_BitFree( vVisited );
    return vNodes;
}